

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManTransformMiter2(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pGVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  
  uVar15 = p->vCos->nSize - p->nRegs;
  if ((uVar15 & 1) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xb96,"Gia_Man_t *Gia_ManTransformMiter2(Gia_Man_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar4);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar4);
  }
  p_00->pName = pcVar9;
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar4);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar4);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar18 = 0;
    do {
      iVar7 = pVVar10->pArray[lVar18];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_001eaf46;
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar19 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar19 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar19 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) {
LAB_001eaf65:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_001eaf65;
      pGVar5[iVar7].Value = (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
      lVar18 = lVar18 + 1;
      pVVar10 = p->vCis;
    } while (lVar18 < pVVar10->nSize);
  }
  iVar7 = p->nObjs;
  if (0 < iVar7) {
    lVar20 = 8;
    lVar18 = 0;
    do {
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar19 = *(ulong *)((long)pGVar5 + lVar20 + -8);
      if ((uVar19 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar19) {
        uVar1 = *(uint *)((long)pGVar5 +
                         lVar20 + (ulong)(uint)((int)(uVar19 & 0x1fffffff) << 2) * -3);
        if (((int)uVar1 < 0) ||
           (uVar2 = *(uint *)((long)pGVar5 +
                             lVar20 + (ulong)((uint)(uVar19 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar2 < 0)) goto LAB_001eaf84;
        iVar7 = Gia_ManHashAnd(p_00,uVar1 ^ (uint)(uVar19 >> 0x1d) & 1,
                               uVar2 ^ (uint)(uVar19 >> 0x3d) & 1);
        *(int *)(&pGVar5->field_0x0 + lVar20) = iVar7;
        iVar7 = p->nObjs;
      }
      lVar18 = lVar18 + 1;
      lVar20 = lVar20 + 0xc;
    } while (lVar18 < iVar7);
  }
  iVar7 = p->nRegs;
  pVVar10 = p->vCos;
  iVar16 = pVVar10->nSize;
  iVar13 = iVar16 - iVar7;
  if (iVar13 != 0 && iVar7 <= iVar16) {
    lVar18 = (long)((int)uVar15 / 2);
    uVar19 = 0;
    do {
      if ((long)iVar16 <= (long)uVar19) goto LAB_001eafa3;
      iVar3 = pVVar10->pArray[uVar19];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_001eaf46;
      if (((uint)((int)uVar15 / 2) == uVar19) || (pGVar5 = p->pObjs, pGVar5 == (Gia_Obj_t *)0x0))
      break;
      if (iVar13 <= lVar18) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar15 < -1) || (iVar16 <= lVar18)) goto LAB_001eafa3;
      uVar1 = pVVar10->pArray[lVar18];
      if (((long)(int)uVar1 < 0) || ((uint)p->nObjs <= uVar1)) goto LAB_001eaf46;
      uVar17 = (uint)*(undefined8 *)(pGVar5 + iVar3);
      uVar2 = (pGVar5 + iVar3)[-(ulong)(uVar17 & 0x1fffffff)].Value;
      if ((int)uVar2 < 0) goto LAB_001eaf84;
      uVar14 = (uint)*(undefined8 *)(pGVar5 + (int)uVar1);
      uVar1 = (pGVar5 + (int)uVar1)[-(ulong)(uVar14 & 0x1fffffff)].Value;
      if ((int)uVar1 < 0) goto LAB_001eaf84;
      iVar7 = Gia_ManHashXor(p_00,uVar17 >> 0x1d & 1 ^ uVar2,uVar14 >> 0x1d & 1 ^ uVar1);
      Gia_ManAppendCo(p_00,iVar7);
      uVar19 = uVar19 + 1;
      iVar7 = p->nRegs;
      pVVar10 = p->vCos;
      iVar16 = pVVar10->nSize;
      iVar13 = iVar16 - iVar7;
      lVar18 = lVar18 + 1;
    } while ((long)uVar19 < (long)iVar13);
  }
  if (0 < iVar7) {
    iVar16 = 0;
    do {
      iVar13 = p->vCos->nSize;
      uVar15 = (iVar13 - iVar7) + iVar16;
      if (((int)uVar15 < 0) || (iVar13 <= (int)uVar15)) {
LAB_001eafa3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = p->vCos->pArray[uVar15];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_001eaf46:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + iVar7;
      if ((int)pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value < 0) {
LAB_001eaf84:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar15 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar5 >> 0x1d & 1 ^
                                    pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value
                              );
      pGVar5->Value = uVar15;
      iVar16 = iVar16 + 1;
      iVar7 = p->nRegs;
    } while (iVar16 < iVar7);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_ManTransformMiter2( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObj2;
    int i, iLit, nPart = Gia_ManPoNum(p)/2;
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
    {
        if ( i == nPart )
            break;
        pObj2 = Gia_ManPo( p, nPart + i );
        iLit = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin0Copy(pObj2) );
        Gia_ManAppendCo( pNew, iLit );
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}